

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

void __thiscall phyr::Transform::Transform(Transform *this)

{
  (this->mat).d[2][2] = 1.0;
  (this->mat).d[1][1] = 1.0;
  (this->mat).d[0][0] = 1.0;
  (this->mat).d[0][1] = 0.0;
  (this->mat).d[0][2] = 0.0;
  (this->mat).d[0][3] = 0.0;
  (this->mat).d[1][0] = 0.0;
  (this->mat).d[1][2] = 0.0;
  (this->mat).d[1][3] = 0.0;
  (this->mat).d[2][0] = 0.0;
  (this->mat).d[2][1] = 0.0;
  (this->mat).d[2][3] = 0.0;
  (this->mat).d[3][0] = 0.0;
  (this->mat).d[3][1] = 0.0;
  (this->mat).d[3][2] = 0.0;
  (this->invMat).d[3][3] = 1.0;
  (this->invMat).d[2][2] = 1.0;
  (this->invMat).d[1][1] = 1.0;
  (this->mat).d[3][3] = 1.0;
  (this->invMat).d[0][0] = 1.0;
  (this->invMat).d[0][1] = 0.0;
  (this->invMat).d[0][2] = 0.0;
  (this->invMat).d[0][3] = 0.0;
  (this->invMat).d[1][0] = 0.0;
  (this->invMat).d[1][2] = 0.0;
  (this->invMat).d[1][3] = 0.0;
  (this->invMat).d[2][0] = 0.0;
  (this->invMat).d[2][1] = 0.0;
  (this->invMat).d[3][1] = 0.0;
  (this->invMat).d[3][2] = 0.0;
  (this->invMat).d[2][3] = 0.0;
  (this->invMat).d[3][0] = 0.0;
  return;
}

Assistant:

Transform() {}